

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

void __thiscall
CLI::App::_parse(App *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  bool positional_only;
  bool local_19;
  
  increment_parsed(this);
  _trigger_pre_parse(this,(long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5);
  local_19 = false;
  while ((args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start !=
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish) {
    _parse_single(this,args,&local_19);
  }
  _process(this);
  _process_extras(this);
  return;
}

Assistant:

CLI11_INLINE void App::_parse(std::vector<std::string> &&args) {
    // this can only be called by the top level in which case parent == nullptr by definition
    // operation is simplified
    increment_parsed();
    _trigger_pre_parse(args.size());
    bool positional_only = false;

    while(!args.empty()) {
        _parse_single(args, positional_only);
    }
    _process();

    // Throw error if any items are left over (depending on settings)
    _process_extras();
}